

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O0

void __thiscall Line::filter(Line *this,Known *known)

{
  size_type sVar1;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_58;
  const_iterator local_50;
  Known *local_48;
  vector<bool,_std::allocator<bool>_> *local_40;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_38;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_30;
  const_iterator local_28;
  int local_1c;
  anon_class_8_1_a8317263_for__M_pred aStack_18;
  int previous_size;
  Known *known_local;
  Line *this_local;
  
  aStack_18.known = known;
  known_local = (Known *)this;
  sVar1 = std::
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          ::size(&this->m_options);
  local_1c = (int)sVar1;
  if (local_1c != 1) {
    local_38._M_current =
         (vector<bool,_std::allocator<bool>_> *)
         std::
         vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ::begin(&this->m_options);
    local_40 = (vector<bool,_std::allocator<bool>_> *)
               std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::end(&this->m_options);
    local_48 = aStack_18.known;
    local_30 = std::
               remove_if<__gnu_cxx::__normal_iterator<std::vector<bool,std::allocator<bool>>*,std::vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>>,Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                         (local_38,(__normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
                                    )local_40,aStack_18);
    __gnu_cxx::
    __normal_iterator<std::vector<bool,std::allocator<bool>>const*,std::vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>>
    ::__normal_iterator<std::vector<bool,std::allocator<bool>>*>
              ((__normal_iterator<std::vector<bool,std::allocator<bool>>const*,std::vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>>
                *)&local_28,&local_30);
    local_58._M_current =
         (vector<bool,_std::allocator<bool>_> *)
         std::
         vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ::end(&this->m_options);
    __gnu_cxx::
    __normal_iterator<std::vector<bool,std::allocator<bool>>const*,std::vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>>
    ::__normal_iterator<std::vector<bool,std::allocator<bool>>*>
              ((__normal_iterator<std::vector<bool,std::allocator<bool>>const*,std::vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>>
                *)&local_50,&local_58);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::erase(&this->m_options,local_28,local_50);
  }
  return;
}

Assistant:

void Line::filter(const Known &known) {
    int previous_size = m_options.size();

    if (previous_size == 1) {
        return;
    }

#if DEBUG_TRACES
    Logger logger(TRACE);
    auto &output = logger.get();
    output << "KNOWN:  ";
    for (int i = 0; i < known.first.size(); i++) {
        output << (known.first[i] ? (known.second[i] ? '1' : '0') : ' ');
    }
    output << endl;
    logger.flush();
#endif //DEBUG_TRACES

    m_options.erase(remove_if(m_options.begin(), m_options.end(), [&known](const vector<bool> &option) {
        return !check_option(known, option);
    }), m_options.end());

#if DEBUG_LOGS
    Logger(DEBUG).get() << "Filter options " << previous_size << " -> " << m_options.size() << endl;
#endif // DEBUG_LOGS
}